

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void vkt::ssbo::anon_unknown_15::generateImmScalarVectorSrc
               (ostream *src,DataType basicType,void *valuePtr)

{
  char *pcVar1;
  ostream *poVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int precision;
  string local_58;
  float *local_38;
  deUint8 *compPtr;
  int scalarNdx;
  int compSize;
  int scalarSize;
  DataType scalarType;
  void *valuePtr_local;
  ostream *poStack_10;
  DataType basicType_local;
  ostream *src_local;
  
  _scalarSize = valuePtr;
  valuePtr_local._4_4_ = basicType;
  poStack_10 = src;
  compSize = glu::getDataTypeScalarType(basicType);
  scalarNdx = glu::getDataTypeScalarSize(valuePtr_local._4_4_);
  poVar2 = poStack_10;
  compPtr._4_4_ = 4;
  precision = extraout_EDX;
  if (1 < scalarNdx) {
    pcVar1 = glu::getDataTypeName(valuePtr_local._4_4_);
    poVar2 = std::operator<<(poVar2,pcVar1);
    std::operator<<(poVar2,"(");
    precision = extraout_EDX_00;
  }
  for (compPtr._0_4_ = 0; (int)compPtr < scalarNdx; compPtr._0_4_ = (int)compPtr + 1) {
    local_38 = (float *)((long)_scalarSize + (long)((int)compPtr << 2));
    if (0 < (int)compPtr) {
      std::operator<<(poStack_10,", ");
      precision = extraout_EDX_01;
    }
    poVar2 = poStack_10;
    switch(compSize) {
    case 1:
      de::floatToString_abi_cxx11_(&local_58,(de *)0x1,*local_38,precision);
      std::operator<<(poVar2,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      precision = extraout_EDX_02;
      break;
    default:
      break;
    case 0x1b:
      std::ostream::operator<<(poStack_10,(int)*local_38);
      precision = extraout_EDX_03;
      break;
    case 0x1f:
      poVar2 = (ostream *)std::ostream::operator<<(poStack_10,(uint)*local_38);
      std::operator<<(poVar2,"u");
      precision = extraout_EDX_04;
      break;
    case 0x23:
      pcVar1 = "false";
      if (*local_38 != 0.0) {
        pcVar1 = "true";
      }
      std::operator<<(poStack_10,pcVar1);
      precision = extraout_EDX_05;
    }
  }
  if (1 < scalarNdx) {
    std::operator<<(poStack_10,")");
  }
  return;
}

Assistant:

void generateImmScalarVectorSrc (std::ostream& src, glu::DataType basicType, const void* valuePtr)
{
	DE_ASSERT(glu::isDataTypeFloatOrVec(basicType)	||
			  glu::isDataTypeIntOrIVec(basicType)	||
			  glu::isDataTypeUintOrUVec(basicType)	||
			  glu::isDataTypeBoolOrBVec(basicType));

	const glu::DataType		scalarType		= glu::getDataTypeScalarType(basicType);
	const int				scalarSize		= glu::getDataTypeScalarSize(basicType);
	const int				compSize		= sizeof(deUint32);

	if (scalarSize > 1)
		src << glu::getDataTypeName(basicType) << "(";

	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
	{
		const deUint8* compPtr = (const deUint8*)valuePtr + scalarNdx*compSize;

		if (scalarNdx > 0)
			src << ", ";

		switch (scalarType)
		{
			case glu::TYPE_FLOAT:	src << de::floatToString(*((const float*)compPtr), 1);			break;
			case glu::TYPE_INT:		src << *((const int*)compPtr);									break;
			case glu::TYPE_UINT:	src << *((const deUint32*)compPtr) << "u";						break;
			case glu::TYPE_BOOL:	src << (*((const deUint32*)compPtr) != 0u ? "true" : "false");	break;
			default:
				DE_ASSERT(false);
		}
	}

	if (scalarSize > 1)
		src << ")";
}